

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm.c
# Opt level: O3

void easm_del_subinsn(easm_subinsn *subinsn)

{
  long lVar1;
  
  if (subinsn != (easm_subinsn *)0x0) {
    if (0 < subinsn->prefsnum) {
      lVar1 = 0;
      do {
        easm_del_expr(subinsn->prefs[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < subinsn->prefsnum);
    }
    free(subinsn->prefs);
    easm_del_sinsn(subinsn->sinsn);
    free(subinsn);
    return;
  }
  return;
}

Assistant:

void easm_del_subinsn(struct easm_subinsn *subinsn) {
	if (!subinsn) return;
	int i;
	for (i = 0; i < subinsn->prefsnum; i++)
		easm_del_expr(subinsn->prefs[i]);
	free(subinsn->prefs);
	easm_del_sinsn(subinsn->sinsn);
	free(subinsn);
}